

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O3

void __thiscall
UKF::SigmaPointPrediction(UKF *this,double delta_t,MatrixXd *Xsig_aug,MatrixXd *Xsig_pred)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_d8;
  double local_c8;
  double dStack_c0;
  
  if (0 < this->n_sigma_) {
    lVar8 = 0;
    do {
      uVar5 = (Xsig_aug->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_rows;
      if ((((((long)uVar5 < 1) ||
            ((Xsig_aug->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols <= lVar8)) || (uVar5 < 2)) || ((uVar5 == 2 || (uVar5 < 4)))) ||
         ((uVar5 == 4 || ((uVar5 < 6 || (uVar5 == 6)))))) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, -1>, Level = 0]"
                     );
      }
      pdVar6 = (Xsig_aug->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      lVar7 = uVar5 * lVar8;
      dStack_c0 = pdVar6[lVar7];
      local_c8 = pdVar6[lVar7 + 1];
      dVar1 = pdVar6[lVar7 + 2];
      dVar13 = pdVar6[lVar7 + 3];
      dVar2 = pdVar6[lVar7 + 4];
      dVar3 = pdVar6[lVar7 + 5];
      dVar4 = pdVar6[lVar7 + 6];
      if (ABS(dVar2) <= 0.001) {
        dVar9 = cos(dVar13);
        dVar11 = sin(dVar13);
        dVar11 = dVar11 * dVar1 * delta_t;
        dVar9 = dVar9 * dVar1 * delta_t;
        local_d8 = dVar2 * delta_t + dVar13;
      }
      else {
        local_d8 = dVar2 * delta_t + dVar13;
        dVar9 = sin(local_d8);
        dVar10 = sin(dVar13);
        dVar11 = cos(dVar13);
        dVar12 = cos(local_d8);
        dVar11 = (dVar1 / dVar2) * (dVar11 - dVar12);
        dVar9 = (dVar1 / dVar2) * (dVar9 - dVar10);
      }
      dStack_c0 = dStack_c0 + dVar9;
      local_c8 = local_c8 + dVar11;
      dVar9 = cos(dVar13);
      dVar13 = sin(dVar13);
      uVar5 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
      if (((long)uVar5 < 1) ||
         ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols <= lVar8)) {
LAB_0010573d:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      dVar11 = dVar3 * 0.5 * delta_t * delta_t;
      pdVar6 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      lVar7 = uVar5 * lVar8;
      pdVar6[lVar7] = dVar9 * dVar11 + dStack_c0;
      if ((uVar5 < 2) || (pdVar6[lVar7 + 1] = dVar11 * dVar13 + local_c8, uVar5 == 2))
      goto LAB_0010573d;
      pdVar6[lVar7 + 2] = dVar3 * delta_t + dVar1;
      if ((uVar5 < 4) ||
         (pdVar6[lVar7 + 3] = dVar4 * 0.5 * delta_t * delta_t + local_d8, uVar5 == 4))
      goto LAB_0010573d;
      pdVar6[lVar7 + 4] = dVar4 * delta_t + dVar2;
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->n_sigma_);
  }
  return;
}

Assistant:

void UKF::SigmaPointPrediction(double delta_t, const MatrixXd &Xsig_aug, MatrixXd &Xsig_pred) {

  //predict sigma points
  for (int i = 0; i < n_sigma_; i++) {

    //extract values for better readability
    double p_x = Xsig_aug(0, i);
    double p_y = Xsig_aug(1, i);
    double v = Xsig_aug(2, i);
    double yaw = Xsig_aug(3, i);
    double yawd = Xsig_aug(4, i);
    double nu_a = Xsig_aug(5, i);
    double nu_yawdd = Xsig_aug(6, i);

    //predicted state values
    double px_p, py_p;

    //avoid division by zero
    if (fabs(yawd) > 0.001) {
      px_p = p_x + v / yawd * ( sin (yaw + yawd*delta_t) - sin(yaw));
      py_p = p_y + v / yawd * ( cos(yaw) - cos(yaw+yawd*delta_t) );
    }
    else {
      px_p = p_x + v*delta_t*cos(yaw);
      py_p = p_y + v*delta_t*sin(yaw);
    }

    double v_p = v;
    double yaw_p = yaw + yawd * delta_t;
    double yawd_p = yawd;

    //add noise
    px_p = px_p + 0.5*nu_a*delta_t*delta_t * cos(yaw);
    py_p = py_p + 0.5*nu_a*delta_t*delta_t * sin(yaw);
    v_p = v_p + nu_a*delta_t;

    yaw_p = yaw_p + 0.5 * nu_yawdd * delta_t * delta_t;
    yawd_p = yawd_p + nu_yawdd * delta_t;

    //write predicted sigma point into right column
    Xsig_pred(0,i) = px_p;
    Xsig_pred(1,i) = py_p;
    Xsig_pred(2,i) = v_p;
    Xsig_pred(3,i) = yaw_p;
    Xsig_pred(4,i) = yawd_p;
  }
}